

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O0

int format_decimal(int64_t v,char *p,int s)

{
  char *__src;
  bool local_31;
  char *h;
  int len;
  int s_local;
  char *p_local;
  int64_t v_local;
  
  h._0_4_ = s;
  _len = p;
  if (v < 0) {
    while (0 < (int)h) {
      *_len = '0';
      h._0_4_ = (int)h + -1;
      _len = _len + 1;
    }
    v_local._4_4_ = -1;
  }
  else {
    h._4_4_ = s;
    _len = p + s;
    p_local = (char *)v;
    do {
      __src = _len + -1;
      _len[-1] = (char)((long)p_local % 10) + '0';
      p_local = (char *)((long)p_local / 10);
      h._4_4_ = h._4_4_ + -1;
      local_31 = 0 < h._4_4_ && 0 < (long)p_local;
      _len = __src;
    } while (local_31);
    if (p_local == (char *)0x0) {
      memmove(p,__src,(long)(s - h._4_4_));
      _len = p + ((long)s - (long)h._4_4_);
      while (0 < h._4_4_) {
        *_len = ' ';
        h._4_4_ = h._4_4_ + -1;
        _len = _len + 1;
      }
      v_local._4_4_ = 0;
    }
    else {
      while (0 < (int)h) {
        *_len = '9';
        h._0_4_ = (int)h + -1;
        _len = _len + 1;
      }
      v_local._4_4_ = -1;
    }
  }
  return v_local._4_4_;
}

Assistant:

static int
format_decimal(int64_t v, char *p, int s)
{
	int len;
	char *h;

	len = s;
	h = p;

	/* Negative values in ar header are meaningless, so use 0. */
	if (v < 0) {
		while (len-- > 0)
			*p++ = '0';
		return (-1);
	}

	p += s;
	do {
		*--p = (char)('0' + (v % 10));
		v /= 10;
	} while (--s > 0 && v > 0);

	if (v == 0) {
		memmove(h, p, len - s);
		p = h + len - s;
		while (s-- > 0)
			*p++ = ' ';
		return (0);
	}
	/* If it overflowed, fill field with max value. */
	while (len-- > 0)
		*p++ = '9';

	return (-1);
}